

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall SocketReceiveMultiplexer::Implementation::Run(Implementation *this)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  pointer pAVar7;
  reference __y;
  iterator iVar8;
  iterator iVar9;
  char *data_00;
  reference pvVar10;
  int *piVar11;
  runtime_error *this_00;
  pointer ppVar12;
  size_t sVar13;
  pointer ppVar14;
  double dVar15;
  double dVar16;
  __normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
  local_238;
  __normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
  local_230;
  iterator i_3;
  bool resort;
  size_t size;
  __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
  local_210;
  iterator i_2;
  char c;
  long timoutSecondsPart;
  double timeoutMs;
  timeval *timeoutPtr;
  timeval timeout;
  IpEndpointName remoteEndpoint;
  int MAX_BUFFER_SIZE;
  double local_1b0;
  pair<double,_AttachedTimerListener> local_1a8;
  __normal_iterator<AttachedTimerListener_*,_std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>_>
  local_190;
  __normal_iterator<AttachedTimerListener_*,_std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>_>
  local_188;
  iterator i_1;
  vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
  timerQueue_;
  double currentTimeMs;
  __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
  local_150;
  __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
  local_148;
  iterator i;
  int fdmax;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  undefined1 local_118 [4];
  uint __i;
  fd_set tempfds;
  fd_set masterfds;
  char *data;
  Implementation *this_local;
  
  this->break_ = false;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    tempfds.fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
  }
  for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
    tempfds.fds_bits[(ulong)__arr_1._4_4_ - 1] = 0;
  }
  lVar6 = (long)(this->breakPipe_[0] / 0x40);
  tempfds.fds_bits[lVar6 + 0xf] =
       1L << ((byte)((long)this->breakPipe_[0] % 0x40) & 0x3f) | tempfds.fds_bits[lVar6 + 0xf];
  i._M_current._4_4_ = this->breakPipe_[0];
  local_148._M_current =
       (pair<PacketListener_*,_UdpSocket_*> *)
       std::
       vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
       ::begin(&this->socketListeners_);
  while( true ) {
    local_150._M_current =
         (pair<PacketListener_*,_UdpSocket_*> *)
         std::
         vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
         ::end(&this->socketListeners_);
    bVar2 = __gnu_cxx::operator!=(&local_148,&local_150);
    iVar5 = i._M_current._4_4_;
    if (!bVar2) break;
    ppVar12 = __gnu_cxx::
              __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
              ::operator->(&local_148);
    iVar4 = UdpSocket::Implementation::Socket(ppVar12->second->impl_);
    if (iVar5 < iVar4) {
      ppVar12 = __gnu_cxx::
                __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
                ::operator->(&local_148);
      i._M_current._4_4_ = UdpSocket::Implementation::Socket(ppVar12->second->impl_);
    }
    ppVar12 = __gnu_cxx::
              __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
              ::operator->(&local_148);
    iVar5 = UdpSocket::Implementation::Socket(ppVar12->second->impl_);
    ppVar12 = __gnu_cxx::
              __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
              ::operator->(&local_148);
    iVar4 = UdpSocket::Implementation::Socket(ppVar12->second->impl_);
    tempfds.fds_bits[(long)(iVar4 / 0x40) + 0xf] =
         1L << ((byte)iVar5 & 0x3f) | tempfds.fds_bits[(long)(iVar4 / 0x40) + 0xf];
    __gnu_cxx::
    __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
    ::operator++(&local_148);
  }
  dVar15 = GetCurrentTimeMs(this);
  std::
  vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
  ::vector((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
            *)&i_1);
  local_188._M_current =
       (AttachedTimerListener *)
       std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>::begin
                 (&this->timerListeners_);
  while( true ) {
    local_190._M_current =
         (AttachedTimerListener *)
         std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>::end
                   (&this->timerListeners_);
    bVar2 = __gnu_cxx::operator!=(&local_188,&local_190);
    if (!bVar2) break;
    pAVar7 = __gnu_cxx::
             __normal_iterator<AttachedTimerListener_*,_std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>_>
             ::operator->(&local_188);
    local_1b0 = dVar15 + (double)pAVar7->initialDelayMs;
    __y = __gnu_cxx::
          __normal_iterator<AttachedTimerListener_*,_std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>_>
          ::operator*(&local_188);
    std::make_pair<double,AttachedTimerListener&>(&local_1a8,&local_1b0,__y);
    std::
    vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
    ::push_back((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                 *)&i_1,&local_1a8);
    __gnu_cxx::
    __normal_iterator<AttachedTimerListener_*,_std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>_>
    ::operator++(&local_188);
  }
  iVar8 = std::
          vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
          ::begin((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                   *)&i_1);
  iVar9 = std::
          vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
          ::end((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                 *)&i_1);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<double,AttachedTimerListener>*,std::vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>>,bool(*)(std::pair<double,AttachedTimerListener>const&,std::pair<double,AttachedTimerListener>const&)>
            ((__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
              )iVar8._M_current,
             (__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
              )iVar9._M_current,CompareScheduledTimerCalls);
  data_00 = (char *)operator_new__(0x1002);
  IpEndpointName::IpEndpointName((IpEndpointName *)&timeout.tv_usec);
  while (((this->break_ ^ 0xffU) & 1) != 0) {
    memcpy(local_118,tempfds.fds_bits + 0xf,0x80);
    timeoutMs = 0.0;
    bVar2 = std::
            vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
            ::empty((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                     *)&i_1);
    if (!bVar2) {
      pvVar10 = std::
                vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                ::front((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                         *)&i_1);
      dVar15 = pvVar10->first;
      dVar16 = GetCurrentTimeMs(this);
      timoutSecondsPart = (long)(dVar15 - dVar16);
      if ((double)timoutSecondsPart < 0.0) {
        timoutSecondsPart = 0;
      }
      timeoutPtr = (timeval *)(long)((double)timoutSecondsPart * 0.001);
      timeout.tv_sec =
           (__time_t)(((double)timoutSecondsPart - (double)((long)timeoutPtr * 1000)) * 1000.0);
      timeoutMs = (double)&timeoutPtr;
    }
    iVar5 = select(i._M_current._4_4_ + 1,(fd_set *)local_118,(fd_set *)0x0,(fd_set *)0x0,
                   (timeval *)timeoutMs);
    if (iVar5 < 0) {
      if ((this->break_ & 1U) != 0) break;
      piVar11 = __errno_location();
      if (*piVar11 != 4) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"select failed\n");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if ((tempfds.fds_bits[(long)(this->breakPipe_[0] / 0x40) + -1] &
          1L << ((byte)((long)this->breakPipe_[0] % 0x40) & 0x3f)) != 0) {
        read(this->breakPipe_[0],(void *)((long)&i_2._M_current + 7),1);
      }
      if ((this->break_ & 1U) != 0) break;
      local_210._M_current =
           (pair<PacketListener_*,_UdpSocket_*> *)
           std::
           vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
           ::begin(&this->socketListeners_);
      while( true ) {
        size = (size_t)std::
                       vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                       ::end(&this->socketListeners_);
        bVar2 = __gnu_cxx::operator!=
                          (&local_210,
                           (__normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
                            *)&size);
        if (!bVar2) break;
        ppVar12 = __gnu_cxx::
                  __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
                  ::operator->(&local_210);
        iVar5 = UdpSocket::Implementation::Socket(ppVar12->second->impl_);
        if (iVar5 < 0) {
          iVar5 = iVar5 + 0x3f;
        }
        uVar1 = tempfds.fds_bits[(long)(iVar5 >> 6) + -1];
        ppVar12 = __gnu_cxx::
                  __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
                  ::operator->(&local_210);
        iVar5 = UdpSocket::Implementation::Socket(ppVar12->second->impl_);
        if ((uVar1 & 1L << ((byte)((long)iVar5 % 0x40) & 0x3f)) != 0) {
          ppVar12 = __gnu_cxx::
                    __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
                    ::operator->(&local_210);
          sVar13 = UdpSocket::ReceiveFrom
                             (ppVar12->second,(IpEndpointName *)&timeout.tv_usec,data_00,0x1002);
          if (sVar13 != 0) {
            ppVar12 = __gnu_cxx::
                      __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
                      ::operator->(&local_210);
            (*ppVar12->first->_vptr_PacketListener[2])
                      (ppVar12->first,data_00,sVar13 & 0xffffffff,&timeout.tv_usec);
            if ((this->break_ & 1U) != 0) break;
          }
        }
        __gnu_cxx::
        __normal_iterator<std::pair<PacketListener_*,_UdpSocket_*>_*,_std::vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>_>
        ::operator++(&local_210);
      }
      dVar15 = GetCurrentTimeMs(this);
      i_3._M_current._7_1_ = 0;
      local_230._M_current =
           (pair<double,_AttachedTimerListener> *)
           std::
           vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
           ::begin((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                    *)&i_1);
      while( true ) {
        local_238._M_current =
             (pair<double,_AttachedTimerListener> *)
             std::
             vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
             ::end((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                    *)&i_1);
        bVar3 = __gnu_cxx::operator!=(&local_230,&local_238);
        bVar2 = false;
        if (bVar3) {
          ppVar14 = __gnu_cxx::
                    __normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                    ::operator->(&local_230);
          bVar2 = ppVar14->first <= dVar15;
        }
        if (!bVar2) break;
        ppVar14 = __gnu_cxx::
                  __normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                  ::operator->(&local_230);
        (**(code **)(*(long *)(ppVar14->second).listener + 0x10))();
        if ((this->break_ & 1U) != 0) break;
        ppVar14 = __gnu_cxx::
                  __normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                  ::operator->(&local_230);
        iVar5 = (ppVar14->second).periodMs;
        ppVar14 = __gnu_cxx::
                  __normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                  ::operator->(&local_230);
        ppVar14->first = (double)iVar5 + ppVar14->first;
        i_3._M_current._7_1_ = 1;
        __gnu_cxx::
        __normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
        ::operator++(&local_230);
      }
      if ((i_3._M_current._7_1_ & 1) != 0) {
        iVar8 = std::
                vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                ::begin((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                         *)&i_1);
        iVar9 = std::
                vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                ::end((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                       *)&i_1);
        std::
        sort<__gnu_cxx::__normal_iterator<std::pair<double,AttachedTimerListener>*,std::vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>>,bool(*)(std::pair<double,AttachedTimerListener>const&,std::pair<double,AttachedTimerListener>const&)>
                  ((__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                    )iVar8._M_current,
                   (__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                    )iVar9._M_current,CompareScheduledTimerCalls);
      }
    }
  }
  if (data_00 != (char *)0x0) {
    operator_delete__(data_00);
  }
  std::
  vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
  ::~vector((vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
             *)&i_1);
  return;
}

Assistant:

void Run()
	{
		break_ = false;
        char *data = 0;
        
        try{
            
            // configure the master fd_set for select()

            fd_set masterfds, tempfds;
            FD_ZERO( &masterfds );
            FD_ZERO( &tempfds );
            
            // in addition to listening to the inbound sockets we
            // also listen to the asynchronous break pipe, so that AsynchronousBreak()
            // can break us out of select() from another thread.
            FD_SET( breakPipe_[0], &masterfds );
            int fdmax = breakPipe_[0];		

            for( std::vector< std::pair< PacketListener*, UdpSocket* > >::iterator i = socketListeners_.begin();
                    i != socketListeners_.end(); ++i ){

                if( fdmax < i->second->impl_->Socket() )
                    fdmax = i->second->impl_->Socket();
                FD_SET( i->second->impl_->Socket(), &masterfds );
            }


            // configure the timer queue
            double currentTimeMs = GetCurrentTimeMs();

            // expiry time ms, listener
            std::vector< std::pair< double, AttachedTimerListener > > timerQueue_;
            for( std::vector< AttachedTimerListener >::iterator i = timerListeners_.begin();
                    i != timerListeners_.end(); ++i )
                timerQueue_.push_back( std::make_pair( currentTimeMs + i->initialDelayMs, *i ) );
            std::sort( timerQueue_.begin(), timerQueue_.end(), CompareScheduledTimerCalls );

            const int MAX_BUFFER_SIZE = 4098;
            data = new char[ MAX_BUFFER_SIZE ];
            IpEndpointName remoteEndpoint;

            struct timeval timeout;

            while( !break_ ){
                tempfds = masterfds;

                struct timeval *timeoutPtr = 0;
                if( !timerQueue_.empty() ){
                    double timeoutMs = timerQueue_.front().first - GetCurrentTimeMs();
                    if( timeoutMs < 0 )
                        timeoutMs = 0;
                
                    long timoutSecondsPart = (long)(timeoutMs * .001);
                    timeout.tv_sec = (time_t)timoutSecondsPart;
                    // 1000000 microseconds in a second
                    timeout.tv_usec = (suseconds_t)((timeoutMs - (timoutSecondsPart * 1000)) * 1000);
                    timeoutPtr = &timeout;
                }

                if( select( fdmax + 1, &tempfds, 0, 0, timeoutPtr ) < 0 ){
                    if( break_ ){
                        break;
                    }else if( errno == EINTR ){
                        // on returning an error, select() doesn't clear tempfds.
                        // so tempfds would remain all set, which would cause read( breakPipe_[0]...
                        // below to block indefinitely. therefore if select returns EINTR we restart
                        // the while() loop instead of continuing on to below.
                        continue;
                    }else{
                        throw std::runtime_error("select failed\n");
                    }
                }

                if( FD_ISSET( breakPipe_[0], &tempfds ) ){
                    // clear pending data from the asynchronous break pipe
                    char c;
                    read( breakPipe_[0], &c, 1 );
                }
                
                if( break_ )
                    break;

                for( std::vector< std::pair< PacketListener*, UdpSocket* > >::iterator i = socketListeners_.begin();
                        i != socketListeners_.end(); ++i ){

                    if( FD_ISSET( i->second->impl_->Socket(), &tempfds ) ){

                        std::size_t size = i->second->ReceiveFrom( remoteEndpoint, data, MAX_BUFFER_SIZE );
                        if( size > 0 ){
                            i->first->ProcessPacket( data, (int)size, remoteEndpoint );
                            if( break_ )
                                break;
                        }
                    }
                }

                // execute any expired timers
                currentTimeMs = GetCurrentTimeMs();
                bool resort = false;
                for( std::vector< std::pair< double, AttachedTimerListener > >::iterator i = timerQueue_.begin();
                        i != timerQueue_.end() && i->first <= currentTimeMs; ++i ){

                    i->second.listener->TimerExpired();
                    if( break_ )
                        break;

                    i->first += i->second.periodMs;
                    resort = true;
                }
                if( resort )
                    std::sort( timerQueue_.begin(), timerQueue_.end(), CompareScheduledTimerCalls );
            }

            delete [] data;
        }catch(...){
            if( data )
                delete [] data;
            throw;
        }
	}